

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ksc5601.h
# Opt level: O0

int ksc5601_wctomb(void *conv,uchar *r,uint wc,int n)

{
  unsigned_short uVar1;
  ushort uVar2;
  byte bVar3;
  unsigned_short c;
  uint i;
  unsigned_short used;
  Summary16 *summary;
  int n_local;
  uint wc_local;
  uchar *r_local;
  void *conv_local;
  
  if (n < 2) {
    conv_local._4_4_ = -2;
  }
  else {
    _i = (Summary16 *)0x0;
    if (wc < 0x460) {
      _i = ksc5601_uni2indx_page00 + (wc >> 4);
    }
    else if ((wc < 0x2000) || (0x266f < wc)) {
      if ((wc < 0x3000) || (0x33df < wc)) {
        if ((wc < 0x4e00) || (0x9f9f < wc)) {
          if ((wc < 0xac00) || (0xd79f < wc)) {
            if ((wc < 0xf900) || (0xfa0f < wc)) {
              if ((0xfeff < wc) && (wc < 0xfff0)) {
                _i = ksc5601_uni2indx_pageff + ((wc >> 4) - 0xff0);
              }
            }
            else {
              _i = ksc5601_uni2indx_pagef9 + ((wc >> 4) - 0xf90);
            }
          }
          else {
            _i = ksc5601_uni2indx_pageac + ((wc >> 4) - 0xac0);
          }
        }
        else {
          _i = ksc5601_uni2indx_page4e + ((wc >> 4) - 0x4e0);
        }
      }
      else {
        _i = ksc5601_uni2indx_page30 + ((wc >> 4) - 0x300);
      }
    }
    else {
      _i = ksc5601_uni2indx_page20 + ((wc >> 4) - 0x200);
    }
    if (_i != (Summary16 *)0x0) {
      bVar3 = (byte)wc & 0xf;
      if (((uint)_i->used & 1 << bVar3) != 0) {
        uVar2 = _i->used & (short)(1 << bVar3) - 1U;
        uVar2 = (uVar2 & 0x5555) + (short)((int)(uVar2 & 0xaaaa) >> 1);
        uVar2 = (uVar2 & 0x3333) + (short)((int)(uVar2 & 0xcccc) >> 2);
        uVar2 = (uVar2 & 0xf0f) + (short)((int)(uVar2 & 0xf0f0) >> 4);
        uVar1 = ksc5601_2charset
                [(int)((uint)_i->indx + (uint)(ushort)((uVar2 & 0xff) + (uVar2 >> 8)))];
        *r = (uchar)(uVar1 >> 8);
        r[1] = (uchar)uVar1;
        return 2;
      }
    }
    conv_local._4_4_ = -1;
  }
  return conv_local._4_4_;
}

Assistant:

static int
ksc5601_wctomb (conv_t conv, unsigned char *r, ucs4_t wc, int n)
{
  if (n >= 2) {
    const Summary16 *summary = NULL;
    if (wc < 0x0460)
      summary = &ksc5601_uni2indx_page00[(wc>>4)];
    else if (wc >= 0x2000 && wc < 0x2670)
      summary = &ksc5601_uni2indx_page20[(wc>>4)-0x200];
    else if (wc >= 0x3000 && wc < 0x33e0)
      summary = &ksc5601_uni2indx_page30[(wc>>4)-0x300];
    else if (wc >= 0x4e00 && wc < 0x9fa0)
      summary = &ksc5601_uni2indx_page4e[(wc>>4)-0x4e0];
    else if (wc >= 0xac00 && wc < 0xd7a0)
      summary = &ksc5601_uni2indx_pageac[(wc>>4)-0xac0];
    else if (wc >= 0xf900 && wc < 0xfa10)
      summary = &ksc5601_uni2indx_pagef9[(wc>>4)-0xf90];
    else if (wc >= 0xff00 && wc < 0xfff0)
      summary = &ksc5601_uni2indx_pageff[(wc>>4)-0xff0];
    if (summary) {
      unsigned short used = summary->used;
      unsigned int i = wc & 0x0f;
      if (used & ((unsigned short) 1 << i)) {
        unsigned short c;
        /* Keep in `used' only the bits 0..i-1. */
        used &= ((unsigned short) 1 << i) - 1;
        /* Add `summary->indx' and the number of bits set in `used'. */
        used = (used & 0x5555) + ((used & 0xaaaa) >> 1);
        used = (used & 0x3333) + ((used & 0xcccc) >> 2);
        used = (used & 0x0f0f) + ((used & 0xf0f0) >> 4);
        used = (used & 0x00ff) + (used >> 8);
        c = ksc5601_2charset[summary->indx + used];
        r[0] = (c >> 8); r[1] = (c & 0xff);
        return 2;
      }
    }
    return RET_ILSEQ;
  }
  return RET_TOOSMALL;
}